

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool __thiscall
libcellml::Validator::ValidatorImpl::hasOneOrTwoMathmlChildren
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  element_type *this_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t local_30;
  size_t childCount;
  ComponentPtr *component_local;
  XmlNodePtr *node_local;
  ValidatorImpl *this_local;
  
  childCount = (size_t)component;
  component_local = (ComponentPtr *)node;
  node_local = (XmlNodePtr *)this;
  local_30 = mathmlChildCount(node);
  if ((local_30 == 1) || (local_30 == 2)) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)component_local);
    XmlNode::name_abi_cxx11_(&local_90,this_00);
    std::operator+(&local_70,"Math has a \'",&local_90);
    std::operator+(&local_50,&local_70,"\' element without exactly one or two MathML children.");
    addMathmlIssue(this,&local_50,MATH_MATHML,(ComponentPtr *)childCount);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Validator::ValidatorImpl::hasOneOrTwoMathmlChildren(const XmlNodePtr &node,
                                                         const ComponentPtr &component)
{
    auto childCount = mathmlChildCount(node);

    if ((childCount != 1) && (childCount != 2)) {
        addMathmlIssue("Math has a '" + node->name() + "' element without exactly one or two MathML children.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}